

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O3

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFullModel
          (ModelLoader *this,Model *fullModel,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,string *filetype)

{
  pointer pcVar1;
  string sVar2;
  bool bVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  emptyRemovedJointPositions;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (filetype->_M_dataplus)._M_p;
  puVar4 = &stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff88,pcVar1,pcVar1 + filetype->_M_string_length);
  sVar2._M_string_length = in_stack_ffffffffffffff90;
  sVar2._M_dataplus._M_p = puVar4;
  sVar2.field_2._M_allocated_capacity = in_stack_ffffffffffffff98;
  sVar2.field_2._8_8_ = in_stack_ffffffffffffffa0;
  bVar3 = loadReducedModelFromFullModel
                    (this,fullModel,consideredJoints,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&local_58,sVar2);
  if (puVar4 != &stack0xffffffffffffff98) {
    operator_delete(puVar4,in_stack_ffffffffffffff98 + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_58);
  return bVar3;
}

Assistant:

bool ModelLoader::loadReducedModelFromFullModel(const Model& fullModel,
                                                    const std::vector< std::string >& consideredJoints,
                                                    const std::string filetype)
    {
        std::unordered_map<std::string, double> emptyRemovedJointPositions;
        return this->loadReducedModelFromFullModel(fullModel, consideredJoints, emptyRemovedJointPositions, filetype);
    }